

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.h
# Opt level: O1

Slice __thiscall leveldb::InternalKey::user_key(InternalKey *this)

{
  ulong uVar1;
  long in_FS_OFFSET;
  Slice SVar2;
  
  uVar1 = (this->rep_)._M_string_length;
  if (uVar1 < 8) {
    __assert_fail("internal_key.size() >= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/dbformat.h"
                  ,0x60,"Slice leveldb::ExtractUserKey(const Slice &)");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    SVar2.size_ = uVar1 - 8;
    SVar2.data_ = (this->rep_)._M_dataplus._M_p;
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

Slice user_key() const { return ExtractUserKey(rep_); }